

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stop_Freeze_R_PDU.cpp
# Opt level: O0

void __thiscall KDIS::PDU::Stop_Freeze_R_PDU::Encode(Stop_Freeze_R_PDU *this,KDataStream *stream)

{
  KDataStream *pKVar1;
  KDataStream *stream_local;
  Stop_Freeze_R_PDU *this_local;
  
  Simulation_Management_Header::Encode((Simulation_Management_Header *)this,stream);
  pKVar1 = DATA_TYPE::operator<<
                     (stream,&(this->super_Stop_Freeze_PDU).m_RealWorldTime.super_DataTypeBase);
  pKVar1 = KDataStream::operator<<(pKVar1,(this->super_Stop_Freeze_PDU).m_ui8Reason);
  pKVar1 = KDataStream::operator<<(pKVar1,(this->super_Stop_Freeze_PDU).m_ui8FrozenBehaviour);
  pKVar1 = KDataStream::operator<<(pKVar1,(this->super_Reliability_Header).m_ui8ReqRelSrv);
  pKVar1 = KDataStream::operator<<
                     (pKVar1,(this->super_Stop_Freeze_PDU).super_Simulation_Management_Header.
                             super_Header.super_Header6.m_ui8Padding2);
  KDataStream::operator<<(pKVar1,(this->super_Stop_Freeze_PDU).m_ui32RequestID);
  return;
}

Assistant:

void Stop_Freeze_R_PDU::Encode( KDataStream & stream ) const
{
    Simulation_Management_Header::Encode( stream );

    stream << KDIS_STREAM m_RealWorldTime
           << m_ui8Reason
           << m_ui8FrozenBehaviour
           << m_ui8ReqRelSrv
           << m_ui8Padding2
           << m_ui32RequestID;
}